

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void slot_error(char *error_string,Am_Slot_Data *slot)

{
  ostream *poVar1;
  Am_Object local_20;
  Am_Object obj;
  Am_Slot_Data *slot_local;
  char *error_string_local;
  
  obj.data = (Am_Object_Data *)slot;
  Am_Wrapper::Note_Reference(&slot->context->super_Am_Wrapper);
  Am_Object::Am_Object(&local_20,(obj.data)->prototype);
  poVar1 = std::operator<<((ostream *)&std::cerr,"** ");
  poVar1 = std::operator<<(poVar1,error_string);
  poVar1 = std::operator<<(poVar1,"  Object = ");
  poVar1 = operator<<(poVar1,&local_20);
  std::operator<<(poVar1,", Slot = ");
  Am_Print_Key((ostream *)&std::cerr,*(Am_Slot_Key *)&(obj.data)->next_part);
  poVar1 = std::operator<<((ostream *)&std::cerr,".");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Am_Error(&local_20,*(Am_Slot_Key *)&(obj.data)->next_part);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

static void
slot_error(const char *error_string, Am_Slot_Data *slot)
{
  slot->context->Note_Reference();
  Am_Object obj = Am_Object(slot->context);
  std::cerr << "** " << error_string << "  Object = " << obj << ", Slot = ";
  Am_Print_Key(std::cerr, slot->key);
  std::cerr << "." << std::endl;
  Am_Error(obj, slot->key);
}